

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
SimpleParallelSimulationDataGenerator::Initialize
          (SimpleParallelSimulationDataGenerator *this,U32 simulation_sample_rate,
          SimpleParallelAnalyzerSettings *settings)

{
  pointer ppSVar1;
  pointer puVar2;
  pointer pCVar3;
  pointer pCVar4;
  SimpleParallelAnalyzerSettings *pSVar5;
  pointer pCVar6;
  char cVar7;
  SimulationChannelDescriptor *pSVar8;
  ulong uVar9;
  long lVar10;
  U16 val;
  undefined6 uStack_3e;
  
  this->mSettings = settings;
  this->mSimulationSampleRateHz = simulation_sample_rate;
  ppSVar1 = (this->mData).
            super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->mData).
      super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    (this->mData).
    super__Vector_base<SimulationChannelDescriptor_*,_std::allocator<SimulationChannelDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar1;
  }
  puVar2 = (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
      .super__Vector_impl_data._M_finish != puVar2) {
    (this->mDataMasks).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pCVar3 = (settings->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar4 = (settings->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = 0;
  for (uVar9 = 0; pSVar5 = this->mSettings,
      ((ulong)((long)pCVar3 - (long)pCVar4) >> 4 & 0xffffffff) != uVar9; uVar9 = uVar9 + 1) {
    pCVar6 = (pSVar5->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
             super__Vector_impl_data._M_start;
    Channel::Channel((Channel *)&val,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    cVar7 = Channel::operator==(pCVar6 + lVar10,(Channel *)&val);
    Channel::~Channel((Channel *)&val);
    if (cVar7 == '\0') {
      _val = SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,
                        (int)(this->mSettings->mDataChannels).
                             super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                             super__Vector_impl_data._M_start + (int)lVar10,
                        this->mSimulationSampleRateHz);
      std::vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>::
      emplace_back<SimulationChannelDescriptor*>
                ((vector<SimulationChannelDescriptor*,std::allocator<SimulationChannelDescriptor*>>
                  *)&this->mData,(SimulationChannelDescriptor **)&val);
      _val = CONCAT62(uStack_3e,(short)(1 << ((byte)uVar9 & 0x1f)));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&this->mDataMasks,(value_type *)&val);
    }
    lVar10 = lVar10 + 0x10;
  }
  if (pSVar5->mClockEdge < (DualEdge|NegEdge)) {
    pSVar8 = (SimulationChannelDescriptor *)
             SimulationChannelDescriptorGroup::Add
                       ((Channel *)&this->mSimulationData,(int)pSVar5 + 0x28,
                        this->mSimulationSampleRateHz);
    this->mClock = pSVar8;
  }
  this->mValue = 0;
  return;
}

Assistant:

void SimpleParallelSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SimpleParallelAnalyzerSettings* settings )
{
    mSettings = settings;
    mSimulationSampleRateHz = simulation_sample_rate;

    mData.clear();
    mDataMasks.clear();

    U32 count = mSettings->mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        if( mSettings->mDataChannels[ i ] == UNDEFINED_CHANNEL )
            continue;
        mData.push_back( mSimulationData.Add( mSettings->mDataChannels[ i ], mSimulationSampleRateHz, BIT_LOW ) );
        U16 val = 1 << i;
        mDataMasks.push_back( val );
    }

    if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::NegEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_LOW );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::PosEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }
    else if( mSettings->mClockEdge == ParallelAnalyzerClockEdge::DualEdge )
    {
        mClock = mSimulationData.Add( mSettings->mClockChannel, mSimulationSampleRateHz, BIT_HIGH );
    }

    mValue = 0;
}